

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_TestShell::
~TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_TestShell
          (TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_TestShell *this)

{
  TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_TestShell *this_local;
  
  ~TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryReporterPlugin, endOfaTestGroupWillReportSo)
{
    UtestForMemoryReportingPlugingTest fourthTest("differentGroupName", NULLPTR);
    UtestForMemoryReportingPlugingTest thirdTest("differentGroupName", &fourthTest);
    UtestForMemoryReportingPlugingTest secondTest("groupname", &thirdTest);
    UtestForMemoryReportingPlugingTest firstTest("groupname", &secondTest);

    mock("formatter").expectOneCall("report_testgroup_end").withParameter("result", result).withParameter("test", &secondTest);
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(firstTest, *result);
    reporter->postTestAction(firstTest, *result);
    reporter->preTestAction(secondTest, *result);
    reporter->postTestAction(secondTest, *result);
    reporter->preTestAction(thirdTest, *result);
    reporter->postTestAction(thirdTest, *result);
}